

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe8At1(uint8_t *buf)

{
  return (ulong)(byte)(*buf * '\x02' | buf[1] >> 7);
}

Assistant:

std::uint64_t readFlUIntBe8At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 1;
    res |= (buf[1] >> 7);
    res &= UINT64_C(0xff);
    return res;
}